

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O1

uint32_t net_uv::net_getsockAddrIPAndPort(sockaddr *addr,string *outIP,uint32_t *outPort)

{
  char *pcVar1;
  ushort uVar2;
  int iVar3;
  uint32_t uVar4;
  sockaddr_in6 *addr_in;
  string strip;
  char szIp [47];
  undefined1 *local_90;
  char *local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  uint32_t *local_70;
  char local_68 [16];
  ulong local_58;
  undefined7 uStack_50;
  undefined1 local_49;
  undefined7 uStack_48;
  undefined8 uStack_41;
  
  if (addr == (sockaddr *)0x0) {
    return 0;
  }
  local_88 = (char *)0x0;
  local_80 = 0;
  local_90 = &local_80;
  local_70 = outPort;
  if (addr->sa_family == 10) {
    uStack_48 = 0;
    uStack_41 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_49 = 0;
    local_68[0] = '\0';
    local_68[1] = '\0';
    local_68[2] = '\0';
    local_68[3] = '\0';
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    local_68[8] = '\0';
    local_68[9] = '\0';
    local_68[10] = '\0';
    local_68[0xb] = '\0';
    local_68[0xc] = '\0';
    local_68[0xd] = '\0';
    local_68[0xe] = '\0';
    local_68[0xf] = '\0';
    iVar3 = uv_ip6_name((sockaddr_in6 *)addr,local_68,0x2e);
    pcVar1 = local_88;
    uVar4 = 0;
    if (iVar3 != 0) goto LAB_0010ebf0;
    strlen(local_68);
    std::__cxx11::string::_M_replace((ulong)&local_90,0,pcVar1,(ulong)local_68);
    uVar2 = *(ushort *)addr->sa_data << 8 | *(ushort *)addr->sa_data >> 8;
    uVar4 = 0x1c;
  }
  else {
    local_68[0] = '\0';
    local_68[1] = '\0';
    local_68[2] = '\0';
    local_68[3] = '\0';
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    local_68[8] = '\0';
    local_68[9] = '\0';
    local_68[10] = '\0';
    local_68[0xb] = '\0';
    local_68[0xc] = '\0';
    local_68[0xd] = '\0';
    local_68[0xe] = '\0';
    local_68[0xf] = '\0';
    local_58 = local_58 & 0xffffffffffffff00;
    iVar3 = uv_ip4_name((sockaddr_in *)addr,local_68,0x10);
    pcVar1 = local_88;
    uVar4 = 0;
    if (iVar3 != 0) goto LAB_0010ebf0;
    strlen(local_68);
    std::__cxx11::string::_M_replace((ulong)&local_90,0,pcVar1,(ulong)local_68);
    uVar2 = *(ushort *)addr->sa_data << 8 | *(ushort *)addr->sa_data >> 8;
    uVar4 = 0x10;
  }
  std::__cxx11::string::_M_assign((string *)outIP);
  *local_70 = (uint)uVar2;
LAB_0010ebf0:
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  return uVar4;
}

Assistant:

uint32_t net_getsockAddrIPAndPort(const struct sockaddr* addr, std::string& outIP, uint32_t& outPort)
{
	if (addr == NULL)
		return 0;

	std::string strip;
	uint32_t addrlen = 0;
	uint32_t port = 0;

	if (addr->sa_family == AF_INET6)
	{
		addrlen = sizeof(struct sockaddr_in6);

		const struct sockaddr_in6* addr_in = (const struct sockaddr_in6*) addr;

		char szIp[NET_UV_INET6_ADDRSTRLEN + 1] = { 0 };
		int32_t r = uv_ip6_name(addr_in, szIp, NET_UV_INET6_ADDRSTRLEN);
		if (r != 0)
		{
			return 0;
		}

		strip = szIp;
		port = ntohs(addr_in->sin6_port);
	}
	else
	{
		addrlen = sizeof(struct sockaddr_in);

		const struct sockaddr_in* addr_in = (const struct sockaddr_in*) addr;

		char szIp[NET_UV_INET_ADDRSTRLEN + 1] = { 0 };
		int32_t r = uv_ip4_name(addr_in, szIp, NET_UV_INET_ADDRSTRLEN);
		if (r != 0)
		{
			return 0;
		}

		strip = szIp;
		port = ntohs(addr_in->sin_port);
	}

	outIP = strip;
	outPort = port;

	return addrlen;
}